

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::DayOfWeekFun::GetFunctions(void)

{
  pointer pSVar1;
  ScalarFunctionSet *in_RDI;
  ScalarFunction *func;
  pointer function;
  BaseScalarFunction local_d0;
  
  GetDatePartFunction<duckdb::DatePart::DayOfWeekOperator>();
  pSVar1 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (function = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
                  super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>
                  ._M_impl.super__Vector_impl_data._M_start; function != pSVar1;
      function = function + 1) {
    BaseScalarFunction::SetReturnsError(&local_d0,&function->super_BaseScalarFunction);
    BaseScalarFunction::~BaseScalarFunction(&local_d0);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet DayOfWeekFun::GetFunctions() {
	auto set = GetDatePartFunction<DatePart::DayOfWeekOperator>();
	for (auto &func : set.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return set;
}